

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

void __thiscall
QWizardField::QWizardField
          (QWizardField *this,QWizardPage *page,QString *spec,QObject *object,char *property,
          char *changedSignal)

{
  DataPointer *pDVar1;
  ulong uVar2;
  qsizetype in_RCX;
  Data *in_RSI;
  QString *in_RDI;
  char *in_R8;
  char *in_R9;
  long in_FS_OFFSET;
  QString *in_stack_ffffffffffffffa8;
  QChar local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = in_RSI;
  QString::QString(in_RDI,in_stack_ffffffffffffffa8);
  *(undefined1 *)&in_RDI[1].d.ptr = 0;
  in_RDI[1].d.size = in_RCX;
  QByteArray::QByteArray((QByteArray *)(in_RDI + 2),in_R8,-1);
  QByteArray::QByteArray((QByteArray *)(in_RDI + 3),in_R9,-1);
  ::QVariant::QVariant((QVariant *)0x7b3373);
  pDVar1 = &in_RDI->d;
  QChar::QChar<char16_t,_true>(&local_a,L'*');
  uVar2 = QString::endsWith((QChar *)&pDVar1->ptr,(uint)(ushort)local_a.ucs);
  if ((uVar2 & 1) != 0) {
    QString::chop((longlong)&(in_RDI->d).ptr);
    *(undefined1 *)&in_RDI[1].d.ptr = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QWizardField::QWizardField(QWizardPage *page, const QString &spec, QObject *object,
                           const char *property, const char *changedSignal)
    : page(page), name(spec), mandatory(false), object(object), property(property),
      changedSignal(changedSignal)
{
    if (name.endsWith(u'*')) {
        name.chop(1);
        mandatory = true;
    }
}